

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O3

fdb_status bgflusher_register_file(filemgr *file,fdb_config *config,err_log_callback *log_callback)

{
  __int_type_conflict1 _Var1;
  avl_node *paVar2;
  char *__dest;
  openfiles_elem query;
  char acStack_548 [1296];
  avl_node local_38;
  
  if (bgflusher_initialized != '\0') {
    _Var1 = (file->status).super___atomic_base<unsigned_char>._M_i;
    if ((_Var1 != '\x01') && (_Var1 != '\x04')) {
      strcpy(acStack_548,file->filename);
      pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
      paVar2 = avl_search(&openfiles,&local_38,_bgflusher_cmp);
      if (paVar2 == (avl_node *)0x0) {
        __dest = (char *)calloc(1,0x528);
        *(filemgr **)(__dest + 0x400) = file;
        strcpy(__dest,file->filename);
        memcpy(__dest + 0x408,config,0xf8);
        __dest[0x500] = '\x01';
        __dest[0x501] = '\0';
        __dest[0x502] = '\0';
        __dest[0x503] = '\0';
        __dest[0x504] = '\0';
        *(err_log_callback **)(__dest + 0x508) = log_callback;
        avl_insert(&openfiles,(avl_node *)(__dest + 0x510),_bgflusher_cmp);
      }
      else {
        if (paVar2[-0xc].right == (avl_node *)0x0) {
          paVar2[-0xc].right = (avl_node *)file;
        }
        *(int *)&paVar2[-1].left = *(int *)&paVar2[-1].left + 1;
        paVar2[-1].right = (avl_node *)log_callback;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    }
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status bgflusher_register_file(struct filemgr *file,
                                   fdb_config *config,
                                   err_log_callback *log_callback)
{
    if (!bgflusher_initialized) return FDB_RESULT_SUCCESS;

    file_status_t fstatus;
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    // Ignore files whose status is FILE_COMPACT_OLD to prevent
    // reinserting of files undergoing compaction if it is in the catchup phase
    // Also ignore files whose status is REMOVED_PENDING.
    fstatus = filemgr_get_file_status(file);
    if (fstatus == FILE_COMPACT_OLD ||
        fstatus == FILE_REMOVED_PENDING) {
        return fs;
    }

    strcpy(query.filename, file->filename);
    // first search the existing file
    mutex_lock(&bgf_lock);
    a = avl_search(&openfiles, &query.avl, _bgflusher_cmp);
    if (a == NULL) {
        // doesn't exist
        // create elem and insert into tree
        elem = (struct openfiles_elem *)calloc(1, sizeof(struct openfiles_elem));
        elem->file = file;
        strcpy(elem->filename, file->filename);
        elem->config = *config;
        elem->register_count = 1;
        elem->background_flush_in_progress = false;
        elem->log_callback = log_callback;
        avl_insert(&openfiles, &elem->avl, _bgflusher_cmp);
    } else {
        // already exists
        elem = _get_entry(a, struct openfiles_elem, avl);
        if (!elem->file) {
            elem->file = file;
        }
        elem->register_count++;
        elem->log_callback = log_callback; // use the latest
    }
    mutex_unlock(&bgf_lock);
    return fs;
}